

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Percentile.cpp
# Opt level: O3

void __thiscall Percentile::modelToQueries(Percentile *this)

{
  _WordT *p_Var1;
  Query **ppQVar2;
  Aggregate *pAVar3;
  Query *pQVar4;
  ulong uVar5;
  ulong uVar6;
  size_t var;
  ulong uVar7;
  Aggregate *agg_1;
  Aggregate *agg;
  Aggregate *local_100;
  Aggregate *local_f8;
  bitset<1500UL> local_f0;
  
  ppQVar2 = (Query **)operator_new__(0x328);
  this->varToQuery = ppQVar2;
  pAVar3 = (Aggregate *)operator_new(0x30);
  (pAVar3->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar3->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar3->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pAVar3->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pAVar3->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pAVar3->_incoming).
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = 0;
  local_f8 = pAVar3;
  memset(&local_f0,0,0xc0);
  std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
  _M_realloc_insert<std::bitset<1500ul>>
            ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar3,(iterator)0x0
             ,&local_f0);
  pQVar4 = (Query *)operator_new(0x30);
  (pQVar4->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
  (pQVar4->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
  (pQVar4->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pQVar4->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pQVar4->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pQVar4->_rootID =
       ((this->_td).super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_root
       ->_id;
  std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
            ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar4->_aggregates,(iterator)0x0,
             &local_f8);
  QueryCompiler::addQuery
            ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             pQVar4);
  this->varToQuery[100] = pQVar4;
  do {
    uVar5 = uVar7 >> 6;
    uVar6 = 1L << ((byte)uVar7 & 0x3f);
    if ((((this->super_Application)._isFeature.super__Base_bitset<2UL>._M_w[uVar5] >> (uVar7 & 0x3f)
         & 1) != 0) &&
       (((this->super_Application)._isCategoricalFeature.super__Base_bitset<2UL>._M_w[uVar5] & uVar6
        ) == 0)) {
      pAVar3 = (Aggregate *)operator_new(0x30);
      (pAVar3->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar3->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar3->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pAVar3->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pAVar3->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pAVar3->_incoming).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_100 = pAVar3;
      memset(&local_f0,0,0xc0);
      std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
      _M_realloc_insert<std::bitset<1500ul>>
                ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)pAVar3,
                 (iterator)0x0,&local_f0);
      pQVar4 = (Query *)operator_new(0x30);
      (pQVar4->_fVars).super__Base_bitset<2UL>._M_w[0] = 0;
      (pQVar4->_fVars).super__Base_bitset<2UL>._M_w[1] = 0;
      (pQVar4->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pQVar4->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pQVar4->_aggregates).super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pQVar4->_rootID = this->_queryRootIndex[uVar7];
      p_Var1 = (pQVar4->_fVars).super__Base_bitset<2UL>._M_w + uVar5;
      *p_Var1 = *p_Var1 | uVar6;
      std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                ((vector<Aggregate*,std::allocator<Aggregate*>> *)&pQVar4->_aggregates,(iterator)0x0
                 ,&local_100);
      QueryCompiler::addQuery
                ((this->_compiler).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pQVar4);
      this->varToQuery[uVar7] = pQVar4;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 100);
  return;
}

Assistant:

void Percentile::modelToQueries()
{
    varToQuery = new Query*[NUM_OF_VARIABLES+1];

    Aggregate* agg = new Aggregate();
    agg->_agg.push_back(prod_bitset());

    Query* count = new Query();
    count->_rootID = _td->_root->_id;
    count->_aggregates.push_back(agg);            
    _compiler->addQuery(count);

    varToQuery[NUM_OF_VARIABLES] = count;

    // Create a query & Aggregate
    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (_isFeature[var] && !_isCategoricalFeature[var])
        {
            Aggregate* agg = new Aggregate();
            agg->_agg.push_back(prod_bitset());

            Query* query = new Query();
            query->_rootID = _queryRootIndex[var];
            query->_fVars.set(var);
            query->_aggregates.push_back(agg);
            
            _compiler->addQuery(query);

            varToQuery[var] = query;
        }
    }
}